

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O0

string * __thiscall
gl3cts::InputVariablesCannotBeModifiedTest::getShaderStageName_abi_cxx11_
          (string *__return_storage_ptr__,InputVariablesCannotBeModifiedTest *this,
          _shader_stage stage)

{
  allocator<char> local_1e;
  undefined1 local_1d;
  _shader_stage local_1c;
  InputVariablesCannotBeModifiedTest *pIStack_18;
  _shader_stage stage_local;
  InputVariablesCannotBeModifiedTest *this_local;
  string *result;
  
  local_1d = 0;
  local_1c = stage;
  pIStack_18 = this;
  this_local = (InputVariablesCannotBeModifiedTest *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"?!",&local_1e);
  std::allocator<char>::~allocator(&local_1e);
  switch(local_1c) {
  case SHADER_STAGE_FRAGMENT:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"fragment shader");
    break;
  case SHADER_STAGE_GEOMETRY:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"geometry shader");
    break;
  case SHADER_STAGE_TESSELLATION_CONTROL:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"tessellation control shader");
    break;
  case SHADER_STAGE_TESSELLATION_EVALUATION:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"tessellation evaluation shader");
    break;
  case SHADER_STAGE_VERTEX:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"vertex shader");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InputVariablesCannotBeModifiedTest::getShaderStageName(_shader_stage stage) const
{
	std::string result = "?!";

	switch (stage)
	{
	case SHADER_STAGE_FRAGMENT:
		result = "fragment shader";
		break;
	case SHADER_STAGE_GEOMETRY:
		result = "geometry shader";
		break;
	case SHADER_STAGE_TESSELLATION_CONTROL:
		result = "tessellation control shader";
		break;
	case SHADER_STAGE_TESSELLATION_EVALUATION:
		result = "tessellation evaluation shader";
		break;
	case SHADER_STAGE_VERTEX:
		result = "vertex shader";
		break;
	} /* switch (stage) */

	return result;
}